

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O3

char * xmlMemStrdupLoc(char *str,char *file,int line)

{
  ulong uVar1;
  xmlGenericErrorFunc p_Var2;
  size_t sVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  undefined8 *puVar6;
  char *__dest;
  uint uVar7;
  
  sVar3 = strlen(str);
  uVar1 = sVar3 + 1;
  if (xmlMemInitialized == '\0') {
    xmlInitMemory();
  }
  if (uVar1 < 0xffffffffffffffd8) {
    puVar6 = (undefined8 *)malloc(sVar3 + 0x29);
    if (puVar6 == (undefined8 *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      *puVar6 = 0x300005aa5;
      puVar6[2] = uVar1;
      puVar6[3] = file;
      *(int *)(puVar6 + 4) = line;
      xmlMutexLock(xmlMemMutex);
      uVar7 = block + 1;
      debugMemSize = uVar1 + debugMemSize;
      debugMemBlocks = debugMemBlocks + 1;
      block = uVar7;
      puVar6[1] = (ulong)uVar7;
      if (debugMaxMemSize < debugMemSize) {
        debugMaxMemSize = debugMemSize;
      }
      xmlMutexUnlock(xmlMemMutex);
      __dest = (char *)(puVar6 + 5);
      if (uVar7 == xmlMemStopAtBlock) {
        pp_Var4 = __xmlGenericError();
        p_Var2 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var2)(*ppvVar5,"xmlMallocBreakpoint reached on block %d\n",(ulong)xmlMemStopAtBlock);
      }
      strcpy(__dest,str);
      if ((char *)xmlMemTraceBlockAt == __dest) {
        pp_Var4 = __xmlGenericError();
        p_Var2 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var2)(*ppvVar5,"%p : Strdup() Ok\n",xmlMemTraceBlockAt);
        pp_Var4 = __xmlGenericError();
        p_Var2 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var2)(*ppvVar5,"xmlMallocBreakpoint reached on block %d\n",(ulong)xmlMemStopAtBlock);
      }
    }
  }
  else {
    pp_Var4 = __xmlGenericError();
    p_Var2 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    __dest = (char *)0x0;
    (*p_Var2)(*ppvVar5,"xmlMemStrdupLoc : Unsigned overflow\n");
  }
  return __dest;
}

Assistant:

char *
xmlMemStrdupLoc(const char *str, const char *file, int line)
{
    char *s;
    size_t size = strlen(str) + 1;
    MEMHDR *p;

    if (!xmlMemInitialized) xmlInitMemory();
    TEST_POINT

    if (size > (MAX_SIZE_T - RESERVE_SIZE)) {
	xmlGenericError(xmlGenericErrorContext,
		"xmlMemStrdupLoc : Unsigned overflow\n");
	xmlMemoryDump();
	return(NULL);
    }

    p = (MEMHDR *) malloc(RESERVE_SIZE+size);
    if (!p) {
      goto error;
    }
    p->mh_tag = MEMTAG;
    p->mh_size = size;
    p->mh_type = STRDUP_TYPE;
    p->mh_file = file;
    p->mh_line = line;
    xmlMutexLock(xmlMemMutex);
    p->mh_number = ++block;
    debugMemSize += size;
    debugMemBlocks++;
    if (debugMemSize > debugMaxMemSize) debugMaxMemSize = debugMemSize;
#ifdef MEM_LIST
    debugmem_list_add(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

    s = (char *) HDR_2_CLIENT(p);

    if (xmlMemStopAtBlock == p->mh_number) xmlMallocBreakpoint();

    strcpy(s,str);

    TEST_POINT

    if (xmlMemTraceBlockAt == s) {
	xmlGenericError(xmlGenericErrorContext,
			"%p : Strdup() Ok\n", xmlMemTraceBlockAt);
	xmlMallocBreakpoint();
    }

    return(s);

error:
    return(NULL);
}